

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void accumulate_counters_enc_workers(AV1_COMP *cpi,int num_workers)

{
  RD_COUNTS *pRVar1;
  int *piVar2;
  uint64_t *puVar3;
  uint *puVar4;
  int (*paiVar5) [2];
  ulong uVar6;
  uint8_t uVar7;
  void *pvVar8;
  long lVar9;
  bool bVar10;
  uint *cnt;
  long lVar11;
  long lVar12;
  int (*paiVar13) [16];
  int j;
  long lVar14;
  ulong uVar15;
  macroblock *x;
  
  if (0 < num_workers) {
    uVar15 = (ulong)(uint)num_workers;
    do {
      pvVar8 = (cpi->mt_info).workers[uVar15 - 1].data1;
      x = *(macroblock **)((long)pvVar8 + 8);
      cpi->intrabc_used = cpi->intrabc_used | *(uint *)(x[1].e_mbd.plane[0].seg_iqmatrix[7] + 3);
      cpi->deltaq_used =
           cpi->deltaq_used | *(uint *)((long)x[1].e_mbd.plane[0].seg_iqmatrix[7] + 0x1c);
      if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
        av1_accumulate_rtc_counters(cpi,x);
        x = *(macroblock **)((long)pvVar8 + 8);
      }
      cpi->palette_pixel_num = cpi->palette_pixel_num + x->palette_pixels;
      if ((ThreadData_conflict *)x != &cpi->td) {
        if ((cpi->sf).inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
          aom_free(x[1].plane[0].src_diff);
          x = *(macroblock **)((long)pvVar8 + 8);
          x[1].plane[0].src_diff = (int16_t *)0x0;
        }
        if ((cpi->sf).intra_sf.dv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
          aom_free(x[1].plane[0].dqcoeff);
          x = *(macroblock **)((long)pvVar8 + 8);
          x[1].plane[0].dqcoeff = (tran_low_t *)0x0;
        }
      }
      uVar7 = ((cpi->common).seq_params)->monochrome;
      aom_free((x->txfm_search_info).mb_rd_record);
      (x->txfm_search_info).mb_rd_record = (MB_RD_RECORD *)0x0;
      aom_free(x->inter_modes_info);
      x->inter_modes_info = (inter_modes_info *)0x0;
      av1_dealloc_src_diff_buf(x,(uint)(uVar7 == '\0') * 2 + 1);
      aom_free((x->e_mbd).seg_mask);
      (x->e_mbd).seg_mask = (uint8_t *)0x0;
      aom_free(x->winner_mode_stats);
      x->winner_mode_stats = (WinnerModeStats *)0x0;
      aom_free(x->dqcoeff_buf);
      x->dqcoeff_buf = (tran_low_t *)0x0;
      if (uVar15 == 1) {
        return;
      }
      lVar9 = *(long *)((long)pvVar8 + 8);
      lVar11 = *(long *)(lVar9 + 0x25c58);
      lVar12 = 0;
      do {
        puVar4 = (cpi->counts).switchable_interp[0] + lVar12;
        *puVar4 = *puVar4 + *(int *)(lVar11 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x30);
      pRVar1 = &(cpi->td).rd_counts;
      uVar6._0_4_ = pRVar1->compound_ref_used_flag;
      uVar6._4_4_ = pRVar1->skip_mode_used_flag;
      uVar6 = uVar6 | *(ulong *)(lVar9 + 0x256c0);
      pRVar1->compound_ref_used_flag = (int)uVar6;
      pRVar1->skip_mode_used_flag = (int)(uVar6 >> 0x20);
      lVar11 = lVar9 + 0x256c8;
      lVar12 = 0;
      paiVar13 = (cpi->td).rd_counts.tx_type_used;
      do {
        lVar14 = 0;
        do {
          (*paiVar13)[lVar14] = (*paiVar13)[lVar14] + *(int *)(lVar11 + lVar14 * 4);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x10);
        lVar12 = lVar12 + 1;
        paiVar13 = paiVar13 + 1;
        lVar11 = lVar11 + 0x40;
      } while (lVar12 != 0x13);
      lVar11 = 0;
      do {
        paiVar5 = (cpi->td).rd_counts.obmc_used + lVar11;
        (*paiVar5)[0] = (*paiVar5)[0] + *(int *)(lVar9 + 0x25b88 + lVar11 * 8);
        piVar2 = (cpi->td).rd_counts.obmc_used[lVar11] + 1;
        *piVar2 = *piVar2 + *(int *)(lVar9 + 0x25b8c + lVar11 * 8);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x16);
      piVar2 = (cpi->td).rd_counts.warped_used;
      *piVar2 = *piVar2 + *(int *)(lVar9 + 0x25c38);
      piVar2 = (cpi->td).rd_counts.warped_used + 1;
      *piVar2 = *piVar2 + *(int *)(lVar9 + 0x25c3c);
      puVar3 = (cpi->td).rd_counts.seg_tmp_pred_cost;
      *puVar3 = *puVar3 + *(long *)(lVar9 + 0x25c48);
      puVar3 = (cpi->td).rd_counts.seg_tmp_pred_cost + 1;
      *puVar3 = *puVar3 + *(long *)(lVar9 + 0x25c50);
      piVar2 = &(cpi->td).rd_counts.newmv_or_intra_blocks;
      *piVar2 = *piVar2 + *(int *)(lVar9 + 0x25c40);
      puVar4 = &(cpi->td).mb.txfm_search_info.txb_split_count;
      *puVar4 = *puVar4 + *(int *)(lVar9 + 0x25618);
      bVar10 = 1 < (long)uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar10);
  }
  return;
}

Assistant:

static inline void accumulate_counters_enc_workers(AV1_COMP *cpi,
                                                   int num_workers) {
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &cpi->mt_info.workers[i];
    EncWorkerData *const thread_data = (EncWorkerData *)worker->data1;
    cpi->intrabc_used |= thread_data->td->intrabc_used;
    cpi->deltaq_used |= thread_data->td->deltaq_used;
    // Accumulate rtc counters.
    if (!frame_is_intra_only(&cpi->common))
      av1_accumulate_rtc_counters(cpi, &thread_data->td->mb);
    cpi->palette_pixel_num += thread_data->td->mb.palette_pixels;
    if (thread_data->td != &cpi->td) {
      // Keep these conditional expressions in sync with the corresponding ones
      // in prepare_enc_workers().
      if (cpi->sf.inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        aom_free(thread_data->td->mv_costs_alloc);
        thread_data->td->mv_costs_alloc = NULL;
      }
      if (cpi->sf.intra_sf.dv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        aom_free(thread_data->td->dv_costs_alloc);
        thread_data->td->dv_costs_alloc = NULL;
      }
    }
    av1_dealloc_mb_data(&thread_data->td->mb, av1_num_planes(&cpi->common));

    // Accumulate counters.
    if (i > 0) {
      av1_accumulate_frame_counts(&cpi->counts, thread_data->td->counts);
      accumulate_rd_opt(&cpi->td, thread_data->td);
      cpi->td.mb.txfm_search_info.txb_split_count +=
          thread_data->td->mb.txfm_search_info.txb_split_count;
#if CONFIG_SPEED_STATS
      cpi->td.mb.txfm_search_info.tx_search_count +=
          thread_data->td->mb.txfm_search_info.tx_search_count;
#endif  // CONFIG_SPEED_STATS
    }
  }
}